

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O0

void __thiscall
CDirectiveConditional::CDirectiveConditional(CDirectiveConditional *this,ConditionType type)

{
  ConditionType type_local;
  CDirectiveConditional *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveConditional_002b2b98;
  Expression::Expression(&this->expression);
  std::shared_ptr<Label>::shared_ptr(&this->label);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&this->ifBlock)
  ;
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
             &this->elseBlock);
  this->type = type;
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->ifBlock,(nullptr_t)0x0);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->elseBlock,(nullptr_t)0x0);
  this->previousResult = false;
  return;
}

Assistant:

CDirectiveConditional::CDirectiveConditional(ConditionType type)
{
	this->type = type;

	ifBlock = nullptr;
	elseBlock = nullptr;
	previousResult = false;
}